

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O1

int __thiscall IMLE::init(IMLE *this,EVP_PKEY_CTX *ctx)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar4;
  undefined8 *puVar5;
  Index dstCols;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  Index dstRows_5;
  long lVar9;
  ActualDstType actualDst;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  string local_48;
  
  lVar6 = (long)this->d;
  if (((this->zeroZZ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_rows != lVar6) ||
     ((this->zeroZZ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_cols != lVar6)) {
    if ((this->d != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar6),0) < lVar6))
    goto LAB_001457e7;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&this->zeroZZ,lVar6 * lVar6,lVar6,lVar6);
  }
  lVar6 = (this->zeroZZ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows * (this->zeroZZ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols;
  if (0 < lVar6) {
    memset((this->zeroZZ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
           .m_data,0,lVar6 * 8);
  }
  lVar6 = (long)this->d;
  if (((this->infinityZZ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
       .m_rows != lVar6) ||
     ((this->infinityZZ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_cols != lVar6)) {
    if ((this->d != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar6),0) < lVar6))
    goto LAB_001457e7;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&this->infinityZZ,lVar6 * lVar6,lVar6,lVar6);
  }
  auVar3 = _DAT_0018b020;
  auVar2 = _DAT_0018b010;
  lVar6 = (this->infinityZZ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_rows *
          (this->infinityZZ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols;
  if (0 < lVar6) {
    pdVar1 = (this->infinityZZ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data;
    uVar7 = lVar6 + 0x1fffffffffffffff;
    uVar8 = uVar7 & 0x1fffffffffffffff;
    auVar10._8_4_ = (int)uVar8;
    auVar10._0_8_ = uVar8;
    auVar10._12_4_ = (int)(uVar8 >> 0x20);
    lVar6 = 0;
    auVar10 = auVar10 ^ _DAT_0018b020;
    do {
      auVar13._8_4_ = (int)lVar6;
      auVar13._0_8_ = lVar6;
      auVar13._12_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar13 = (auVar13 | auVar2) ^ auVar3;
      if ((bool)(~(auVar13._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar13._0_4_ ||
                  auVar10._4_4_ < auVar13._4_4_) & 1)) {
        pdVar1[lVar6] = INFINITY;
      }
      if ((auVar13._12_4_ != auVar10._12_4_ || auVar13._8_4_ <= auVar10._8_4_) &&
          auVar13._12_4_ <= auVar10._12_4_) {
        pdVar1[lVar6 + 1] = INFINITY;
      }
      lVar6 = lVar6 + 2;
    } while ((uVar8 - ((uint)uVar7 & 1)) + 2 != lVar6);
  }
  if ((this->zeroZ).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != (long)this->d) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->zeroZ).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (long)this->d,1);
  }
  lVar6 = (this->zeroZ).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  if (0 < lVar6) {
    memset((this->zeroZ).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data,0,lVar6 << 3);
  }
  if ((this->zeroX).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != (long)this->D) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->zeroX).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (long)this->D,1);
  }
  lVar6 = (this->zeroX).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  if (0 < lVar6) {
    memset((this->zeroX).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data,0,lVar6 << 3);
  }
  if ((this->infinityX).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows != (long)this->D) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&(this->infinityX).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (long)this->D,1);
  }
  auVar3 = _DAT_0018b020;
  auVar2 = _DAT_0018b010;
  lVar6 = (this->infinityX).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
          .m_rows;
  if (0 < lVar6) {
    pdVar1 = (this->infinityX).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    uVar7 = lVar6 + 0x1fffffffffffffff;
    uVar8 = uVar7 & 0x1fffffffffffffff;
    auVar11._8_4_ = (int)uVar8;
    auVar11._0_8_ = uVar8;
    auVar11._12_4_ = (int)(uVar8 >> 0x20);
    lVar6 = 0;
    auVar11 = auVar11 ^ _DAT_0018b020;
    do {
      auVar14._8_4_ = (int)lVar6;
      auVar14._0_8_ = lVar6;
      auVar14._12_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar10 = (auVar14 | auVar2) ^ auVar3;
      if ((bool)(~(auVar10._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar10._0_4_ ||
                  auVar11._4_4_ < auVar10._4_4_) & 1)) {
        pdVar1[lVar6] = INFINITY;
      }
      if ((auVar10._12_4_ != auVar11._12_4_ || auVar10._8_4_ <= auVar11._8_4_) &&
          auVar10._12_4_ <= auVar11._12_4_) {
        pdVar1[lVar6 + 1] = INFINITY;
      }
      lVar6 = lVar6 + 2;
    } while ((uVar8 - ((uint)uVar7 & 1)) + 2 != lVar6);
  }
  lVar9 = (long)this->D;
  lVar6 = (long)this->d;
  if (((this->zeroXZ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_rows != lVar9) ||
     ((this->zeroXZ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_cols != lVar6)) {
    if ((this->d != 0 && this->D != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar6),0) < lVar9))
    goto LAB_001457e7;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&this->zeroXZ,lVar6 * lVar9,lVar9,lVar6);
  }
  lVar6 = (this->zeroXZ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows * (this->zeroXZ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols;
  if (0 < lVar6) {
    memset((this->zeroXZ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
           .m_data,0,lVar6 * 8);
  }
  lVar9 = (long)this->D;
  lVar6 = (long)this->d;
  if (((this->infinityXZ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
       .m_rows != lVar9) ||
     ((this->infinityXZ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_cols != lVar6)) {
    if ((this->d != 0 && this->D != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar6),0) < lVar9)) {
LAB_001457e7:
      puVar5 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar5 = operator_delete;
      __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&this->infinityXZ,lVar6 * lVar9,lVar9,lVar6);
  }
  auVar3 = _DAT_0018b020;
  auVar2 = _DAT_0018b010;
  lVar6 = (this->infinityXZ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_rows *
          (this->infinityXZ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols;
  if (0 < lVar6) {
    pdVar1 = (this->infinityXZ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data;
    uVar7 = lVar6 + 0x1fffffffffffffff;
    uVar8 = uVar7 & 0x1fffffffffffffff;
    auVar12._8_4_ = (int)uVar8;
    auVar12._0_8_ = uVar8;
    auVar12._12_4_ = (int)(uVar8 >> 0x20);
    lVar6 = 0;
    auVar12 = auVar12 ^ _DAT_0018b020;
    do {
      auVar15._8_4_ = (int)lVar6;
      auVar15._0_8_ = lVar6;
      auVar15._12_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar10 = (auVar15 | auVar2) ^ auVar3;
      if ((bool)(~(auVar10._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar10._0_4_ ||
                  auVar12._4_4_ < auVar10._4_4_) & 1)) {
        pdVar1[lVar6] = INFINITY;
      }
      if ((auVar10._12_4_ != auVar12._12_4_ || auVar10._8_4_ <= auVar12._8_4_) &&
          auVar10._12_4_ <= auVar12._12_4_) {
        pdVar1[lVar6 + 1] = INFINITY;
      }
      lVar6 = lVar6 + 2;
    } while ((uVar8 - ((uint)uVar7 & 1)) + 2 != lVar6);
  }
  std::vector<int,_std::allocator<int>_>::reserve(&this->sNearest,0x800);
  std::vector<int,_std::allocator<int>_>::reserve(&this->sNearestInv,0x800);
  std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::reserve
            (&(this->experts).
              super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
             ,(long)(int)ctx);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::reserve(&this->predictions,0x10);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::reserve(&this->predictionsVar,0x10);
  std::vector<double,_std::allocator<double>_>::reserve(&this->predictionsWeight,0x10);
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::reserve(&this->predictionsJacobian,0x10);
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::reserve(&this->predictionsVarJacobian,0x10);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::reserve(&this->invPredictions,0x10);
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::reserve(&this->invPredictionsVar,0x10);
  std::vector<double,_std::allocator<double>_>::reserve(&this->invPredictionsWeight,0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"IMLE object created.","");
  message(this,&local_48);
  iVar4 = extraout_EAX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
    iVar4 = extraout_EAX_00;
  }
  return iVar4;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::init(int pre_alloc)
{
    zeroZZ = ZZ::Zero(d,d); //Template: ZZ::Zero()
    infinityZZ = ZZ::Constant( d,d, std::numeric_limits<Scal>::infinity() ); //Template: ZZ::Constant( std::numeric_limits<Scal>::infinity() )
    zeroZ = Z::Zero(d);     //Template: Z::Zero()
    zeroX = X::Zero(D);     //Template: X::Zero()
	infinityX = X::Constant( D, std::numeric_limits<Scal>::infinity() ); //Template: X::Constant( std::numeric_limits<Scal>::infinity() )
    zeroXZ = XZ::Zero(D,d); //Template: XZ::Zero()
    infinityXZ = XZ::Constant( D,d, std::numeric_limits<Scal>::infinity() ); //Template: XZ::Constant( std::numeric_limits<Scal>::infinity() )

    sNearest.reserve(INIT_SIZE);
    sNearestInv.reserve(INIT_SIZE);

    experts.reserve( pre_alloc );

	predictions.reserve(MAX_NUMBER_OF_SOLUTIONS);
	predictionsVar.reserve(MAX_NUMBER_OF_SOLUTIONS);
	predictionsWeight.reserve(MAX_NUMBER_OF_SOLUTIONS);
	predictionsJacobian.reserve(MAX_NUMBER_OF_SOLUTIONS);
	predictionsVarJacobian.reserve(MAX_NUMBER_OF_SOLUTIONS);
	invPredictions.reserve(MAX_NUMBER_OF_SOLUTIONS);
	invPredictionsVar.reserve(MAX_NUMBER_OF_SOLUTIONS);
	invPredictionsWeight.reserve(MAX_NUMBER_OF_SOLUTIONS);

	message(IMLE_CRTD);
}